

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_test.cc
# Opt level: O1

string * gtest_AllBase64Test_EvalGenerateName__abi_cxx11_
                   (string *__return_storage_ptr__,TestParamInfo<Base64TestVector> *info)

{
  bool bVar1;
  testing atStack_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (!bVar1) {
    testing::ValuesIn<Base64TestVector_const*>
              (atStack_28,kTestVectors,
               (Base64TestVector *)&testing::WithParamInterface<Base64TestVector>::typeinfo);
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_20->_M_use_count = local_20->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_20->_M_use_count = local_20->_M_use_count + 1;
      }
    }
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    }
  }
  testing::internal::DefaultParamName<Base64TestVector>(__return_storage_ptr__,info);
  return __return_storage_ptr__;
}

Assistant:

static std::string RemoveNewlines(const char *in) {
  std::string ret;
  const size_t in_len = strlen(in);

  for (size_t i = 0; i < in_len; i++) {
    if (in[i] != '\n') {
      ret.push_back(in[i]);
    }
  }

  return ret;
}